

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cc
# Opt level: O0

symTab * __thiscall dh::symTab::get_in_function_abi_cxx11_(symTab *this)

{
  long in_RSI;
  symTab *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x48));
  return this;
}

Assistant:

::std::string symTab::get_in_function() const
{
	return this->in_function;
}